

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

precise_unit units::unit_quick_match(string *unit_string,uint64_t match_flags)

{
  char *pcVar1;
  ulong uVar2;
  __const_iterator __position;
  precise_unit pVar3;
  precise_unit pVar4;
  precise_unit pVar5;
  precise_unit pVar6;
  
  if (((uint)match_flags >> 9 & 1) != 0) {
    cleanUnitString(unit_string,match_flags);
  }
  pVar6 = get_unit(unit_string,match_flags);
  if (pVar6.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar6.multiplier_)) {
    return pVar6;
  }
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  uVar2 = unit_string->_M_string_length;
  if ((uVar2 < 3) || (pcVar1[uVar2 - 1] != 's')) {
    pVar4.base_units_ = (unit_data)0xfa94a488;
    pVar4.commodity_ = 0;
    pVar4.multiplier_ = NAN;
    pVar6.base_units_ = (unit_data)0xfa94a488;
    pVar6.commodity_ = 0;
    pVar6.multiplier_ = NAN;
    if (*pcVar1 != '[') {
      return pVar6;
    }
    if (pcVar1[uVar2 - 1] != ']') {
      return pVar4;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string);
    __position._M_current = (unit_string->_M_dataplus)._M_p;
    if ((byte)(__position._M_current[unit_string->_M_string_length - 1] | 0x20U) == 0x75)
    goto LAB_003162fe;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (unit_string,__position);
    pVar6 = get_unit(unit_string,match_flags);
    pVar5.base_units_ = (unit_data)0xfa94a488;
    pVar5.commodity_ = 0;
    pVar5.multiplier_ = NAN;
    if (pVar6.base_units_ == (unit_data)0xfa94a488 && NAN(pVar6.multiplier_)) {
      return pVar5;
    }
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string);
    pVar6 = get_unit(unit_string,match_flags);
    if (pVar6.base_units_ == (unit_data)0xfa94a488 && NAN(pVar6.multiplier_)) {
LAB_003162fe:
      pVar3.base_units_ = (unit_data)0xfa94a488;
      pVar3.commodity_ = 0;
      pVar3.multiplier_ = NAN;
      return pVar3;
    }
  }
  return pVar6;
}

Assistant:

static precise_unit
    unit_quick_match(std::string unit_string, std::uint64_t match_flags)
{
    if ((match_flags & case_insensitive) != 0) {  // if not a case insensitive
                                                  // matching process just do a
                                                  // quick scan first
        cleanUnitString(unit_string, match_flags);
    }
    auto retunit = get_unit(unit_string, match_flags);
    if (is_valid(retunit)) {
        return retunit;
    }
    if (unit_string.size() > 2 &&
        unit_string.back() == 's') {  // if the string is of length two this
                                      // is too risky to try since there
                                      // would be many incorrect matches
        unit_string.pop_back();
        retunit = get_unit(unit_string, match_flags);
        if (is_valid(retunit)) {
            return retunit;
        }
    } else if (unit_string.front() == '[' && unit_string.back() == ']') {
        unit_string.pop_back();
        if (unit_string.back() != 'U' && unit_string.back() != 'u') {
            unit_string.erase(unit_string.begin());
            retunit = get_unit(unit_string, match_flags);
            if (is_valid(retunit)) {
                return retunit;
            }
        }
    }
    return precise::invalid;
}